

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

WriteToEndpoint *
soul::HEARTGenerator::getTopLevelWriteToEndpoint
          (WriteToEndpoint *ws,
          ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *values)

{
  bool bVar1;
  pool_ref<soul::AST::Expression> *insertPos;
  WriteToEndpoint *pWVar2;
  pool_ref<soul::AST::Expression> local_30;
  pool_ptr<soul::AST::WriteToEndpoint> local_28;
  pool_ptr<soul::AST::WriteToEndpoint> chainedWrite;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *values_local;
  WriteToEndpoint *ws_local;
  
  chainedWrite.object = (WriteToEndpoint *)values;
  insertPos = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::begin(values);
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::insert
            (values,insertPos,&ws->value);
  local_30.object = (ws->target).object;
  cast<soul::AST::WriteToEndpoint,soul::AST::Expression>((soul *)&local_28,&local_30);
  pool_ref<soul::AST::Expression>::~pool_ref(&local_30);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_28);
  if (bVar1) {
    pWVar2 = pool_ptr<soul::AST::WriteToEndpoint>::operator*(&local_28);
    ws_local = getTopLevelWriteToEndpoint(pWVar2,chainedWrite.object);
  }
  pool_ptr<soul::AST::WriteToEndpoint>::~pool_ptr(&local_28);
  pWVar2 = ws;
  if (bVar1) {
    pWVar2 = ws_local;
  }
  ws_local = pWVar2;
  return ws_local;
}

Assistant:

static AST::WriteToEndpoint& getTopLevelWriteToEndpoint (AST::WriteToEndpoint& ws, ArrayWithPreallocation<pool_ref<AST::Expression>, 4>& values)
    {
        values.insert (values.begin(), ws.value);

        if (auto chainedWrite = cast<AST::WriteToEndpoint> (ws.target))
            return getTopLevelWriteToEndpoint (*chainedWrite, values);

        return ws;
    }